

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspFacade::Statistics::initLevel(Statistics *this,uint32 level)

{
  SolverStats *this_00;
  ulong uVar1;
  
  if (this->level_ < level) {
    if ((1 < (this->self_->accu_).ptr_) && ((this->solvers_).multi == (SolverStats *)0x0)) {
      this_00 = (SolverStats *)operator_new(0x40);
      SolverStats::SolverStats(this_00);
      (this->solvers_).multi = this_00;
    }
    this->level_ = level;
  }
  uVar1 = (this->self_->ctx).sccGraph.ptr_ & 0xfffffffffffffffe;
  if (((uVar1 != 0) && (*(int *)(uVar1 + 0x28) != 0)) && (this->tester_ == (TesterStats *)0x0)) {
    this->tester_ = *(TesterStats **)(uVar1 + 0x30);
  }
  return;
}

Assistant:

void ClaspFacade::Statistics::initLevel(uint32 level) {
	if (level_ < level) {
		if (incremental() && !solvers_.multi) { solvers_.multi = new SolverStats(); }
		level_ = level;
	}
	if (self_->ctx.sccGraph.get() && self_->ctx.sccGraph->numNonHcfs() && !tester_) {
		tester_ = self_->ctx.sccGraph->nonHcfStats();
	}
}